

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O3

int __thiscall OutputBuffer::write2buf(OutputBuffer *this,char *data,int len)

{
  int *piVar1;
  Mempool *pMVar2;
  Chunk *this_00;
  undefined8 uVar3;
  EVP_PKEY_CTX *src;
  
  this_00 = (this->super_BufferBase).data_buf;
  if (this_00 == (Chunk *)0x0) {
    pMVar2 = Mempool::get_instance();
    this_00 = Mempool::alloc_chunk(pMVar2,len);
    (this->super_BufferBase).data_buf = this_00;
    if (this_00 == (Chunk *)0x0) {
      if (pr_level < 2) {
        return -1;
      }
      uVar3 = 0x6d;
LAB_00104f57:
      printf("[%-5s][%s:%d] no free buf for alloc\n","info","write2buf",uVar3);
      return -1;
    }
  }
  else {
    if (this_00->head != 0) {
      __assert_fail("data_buf->head == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                    ,0x72,"int OutputBuffer::write2buf(const char *, int)");
    }
    if (this_00->capacity - this_00->length < len) {
      pMVar2 = Mempool::get_instance();
      this_00 = Mempool::alloc_chunk(pMVar2,((this->super_BufferBase).data_buf)->length + len);
      if (this_00 == (Chunk *)0x0) {
        if (pr_level < 2) {
          return -1;
        }
        uVar3 = 0x76;
        goto LAB_00104f57;
      }
      Chunk::copy(this_00,(EVP_PKEY_CTX *)(this->super_BufferBase).data_buf,src);
      pMVar2 = Mempool::get_instance();
      Mempool::retrieve(pMVar2,(this->super_BufferBase).data_buf);
      (this->super_BufferBase).data_buf = this_00;
    }
  }
  memcpy(this_00->data + this_00->length,data,(long)len);
  piVar1 = &((this->super_BufferBase).data_buf)->length;
  *piVar1 = *piVar1 + len;
  return 0;
}

Assistant:

int OutputBuffer::write2buf(const char *data, int len)
{
    if (data_buf == nullptr) {
        data_buf = Mempool::get_instance().alloc_chunk(len);
        if (data_buf == nullptr) {
            PR_INFO("no free buf for alloc\n");
            return -1;
        }
    }
    else {
        assert(data_buf->head == 0);
        if (data_buf->capacity - data_buf->length < len) {
            Chunk *new_buf = Mempool::get_instance().alloc_chunk(len + data_buf->length);
            if (new_buf == nullptr) {
                PR_INFO("no free buf for alloc\n");
                return -1;
            }
            new_buf->copy(data_buf);
            Mempool::get_instance().retrieve(data_buf);
            data_buf = new_buf;
        }
    }

    memcpy(data_buf->data + data_buf->length, data, len);
    data_buf->length += len;

    return 0;
}